

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.cpp
# Opt level: O1

void __thiscall embree::LineSegments::commit(LineSegments *this)

{
  byte *pbVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  size_t sVar3;
  BufferView<embree::Vec3fa> *pBVar4;
  Device *pDVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  int iVar12;
  size_t sVar13;
  undefined3 uVar14;
  char cVar15;
  uint uVar16;
  Buffer *pBVar17;
  char *pcVar18;
  ulong uVar19;
  undefined8 *puVar20;
  bool bVar21;
  size_t *psVar22;
  long lVar23;
  ulong uVar24;
  bool bVar25;
  Ref<embree::Buffer> buffer;
  Ref<embree::Buffer> local_48;
  long local_40;
  
  uVar16 = (this->super_Geometry).numTimeSteps;
  if (uVar16 != 0) {
    pBVar2 = (this->vertices).items;
    psVar22 = &(pBVar2->super_RawBufferView).stride;
    do {
      if ((int)*psVar22 != (int)(pBVar2->super_RawBufferView).stride) {
        puVar20 = (undefined8 *)__cxa_allocate_exception(0x30);
        local_48.ptr = (Buffer *)&stack0xffffffffffffffc8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,
                   "stride of vertex buffers have to be identical for each time step","");
        *puVar20 = &PTR__rtcore_error_022018b0;
        *(undefined4 *)(puVar20 + 1) = 3;
        puVar20[2] = puVar20 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar20 + 2),local_48.ptr,
                   (undefined1 *)((long)&((local_48.ptr)->super_RefCount)._vptr_RefCount + local_40)
                  );
        __cxa_throw(puVar20,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      psVar22 = psVar22 + 7;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  sVar3 = (this->normals).size_active;
  if (sVar3 != 0) {
    pBVar4 = (this->normals).items;
    lVar23 = 0;
    do {
      if (*(int *)((long)&(pBVar4->super_RawBufferView).stride + lVar23) !=
          (int)(pBVar4->super_RawBufferView).stride) {
        puVar20 = (undefined8 *)__cxa_allocate_exception(0x30);
        local_48.ptr = (Buffer *)&stack0xffffffffffffffc8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,
                   "stride of normal buffers have to be identical for each time step","");
        *puVar20 = &PTR__rtcore_error_022018b0;
        *(undefined4 *)(puVar20 + 1) = 3;
        puVar20[2] = puVar20 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar20 + 2),local_48.ptr,
                   (undefined1 *)((long)&((local_48.ptr)->super_RefCount)._vptr_RefCount + local_40)
                  );
        __cxa_throw(puVar20,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      lVar23 = lVar23 + 0x38;
    } while (sVar3 * 0x38 - lVar23 != 0);
  }
  pBVar2 = (this->vertices).items;
  uVar6 = *(undefined4 *)&(pBVar2->super_RawBufferView).ptr_ofs;
  uVar7 = *(undefined4 *)((long)&(pBVar2->super_RawBufferView).ptr_ofs + 4);
  uVar8 = *(undefined4 *)&(pBVar2->super_RawBufferView).dptr_ofs;
  uVar9 = *(undefined4 *)((long)&(pBVar2->super_RawBufferView).dptr_ofs + 4);
  sVar3 = (pBVar2->super_RawBufferView).stride;
  uVar10 = *(undefined4 *)((long)&(pBVar2->super_RawBufferView).stride + 4);
  sVar13 = (pBVar2->super_RawBufferView).num;
  uVar11 = *(undefined4 *)((long)&(pBVar2->super_RawBufferView).num + 4);
  uVar16 = (pBVar2->super_RawBufferView).modCounter;
  bVar21 = (pBVar2->super_RawBufferView).modified;
  uVar14 = *(undefined3 *)&(pBVar2->super_RawBufferView).field_0x29;
  iVar12 = (pBVar2->super_RawBufferView).userData;
  (this->vertices0).super_RawBufferView.format = (pBVar2->super_RawBufferView).format;
  (this->vertices0).super_RawBufferView.modCounter = uVar16;
  (this->vertices0).super_RawBufferView.modified = bVar21;
  *(undefined3 *)&(this->vertices0).super_RawBufferView.field_0x29 = uVar14;
  (this->vertices0).super_RawBufferView.userData = iVar12;
  *(int *)&(this->vertices0).super_RawBufferView.stride = (int)sVar3;
  *(undefined4 *)((long)&(this->vertices0).super_RawBufferView.stride + 4) = uVar10;
  *(int *)&(this->vertices0).super_RawBufferView.num = (int)sVar13;
  *(undefined4 *)((long)&(this->vertices0).super_RawBufferView.num + 4) = uVar11;
  *(undefined4 *)&(this->vertices0).super_RawBufferView.ptr_ofs = uVar6;
  *(undefined4 *)((long)&(this->vertices0).super_RawBufferView.ptr_ofs + 4) = uVar7;
  *(undefined4 *)&(this->vertices0).super_RawBufferView.dptr_ofs = uVar8;
  *(undefined4 *)((long)&(this->vertices0).super_RawBufferView.dptr_ofs + 4) = uVar9;
  pBVar17 = (pBVar2->super_RawBufferView).buffer.ptr;
  if (pBVar17 != (Buffer *)0x0) {
    (*(pBVar17->super_RefCount)._vptr_RefCount[2])();
  }
  pBVar17 = (this->vertices0).super_RawBufferView.buffer.ptr;
  if (pBVar17 != (Buffer *)0x0) {
    (*(pBVar17->super_RefCount)._vptr_RefCount[3])();
  }
  (this->vertices0).super_RawBufferView.buffer.ptr = (pBVar2->super_RawBufferView).buffer.ptr;
  if (((uint)(this->super_Geometry).field_8 & 3) == 2) {
    pBVar4 = (this->normals).items;
    uVar6 = *(undefined4 *)&(pBVar4->super_RawBufferView).ptr_ofs;
    uVar7 = *(undefined4 *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + 4);
    uVar8 = *(undefined4 *)&(pBVar4->super_RawBufferView).dptr_ofs;
    uVar9 = *(undefined4 *)((long)&(pBVar4->super_RawBufferView).dptr_ofs + 4);
    sVar3 = (pBVar4->super_RawBufferView).stride;
    uVar10 = *(undefined4 *)((long)&(pBVar4->super_RawBufferView).stride + 4);
    sVar13 = (pBVar4->super_RawBufferView).num;
    uVar11 = *(undefined4 *)((long)&(pBVar4->super_RawBufferView).num + 4);
    uVar16 = (pBVar4->super_RawBufferView).modCounter;
    bVar21 = (pBVar4->super_RawBufferView).modified;
    uVar14 = *(undefined3 *)&(pBVar4->super_RawBufferView).field_0x29;
    iVar12 = (pBVar4->super_RawBufferView).userData;
    (this->normals0).super_RawBufferView.format = (pBVar4->super_RawBufferView).format;
    (this->normals0).super_RawBufferView.modCounter = uVar16;
    (this->normals0).super_RawBufferView.modified = bVar21;
    *(undefined3 *)&(this->normals0).super_RawBufferView.field_0x29 = uVar14;
    (this->normals0).super_RawBufferView.userData = iVar12;
    *(int *)&(this->normals0).super_RawBufferView.stride = (int)sVar3;
    *(undefined4 *)((long)&(this->normals0).super_RawBufferView.stride + 4) = uVar10;
    *(int *)&(this->normals0).super_RawBufferView.num = (int)sVar13;
    *(undefined4 *)((long)&(this->normals0).super_RawBufferView.num + 4) = uVar11;
    *(undefined4 *)&(this->normals0).super_RawBufferView.ptr_ofs = uVar6;
    *(undefined4 *)((long)&(this->normals0).super_RawBufferView.ptr_ofs + 4) = uVar7;
    *(undefined4 *)&(this->normals0).super_RawBufferView.dptr_ofs = uVar8;
    *(undefined4 *)((long)&(this->normals0).super_RawBufferView.dptr_ofs + 4) = uVar9;
    pBVar17 = (pBVar4->super_RawBufferView).buffer.ptr;
    if (pBVar17 != (Buffer *)0x0) {
      (*(pBVar17->super_RefCount)._vptr_RefCount[2])();
    }
    pBVar17 = (this->normals0).super_RawBufferView.buffer.ptr;
    if (pBVar17 != (Buffer *)0x0) {
      (*(pBVar17->super_RefCount)._vptr_RefCount[3])();
    }
    (this->normals0).super_RawBufferView.buffer.ptr = (pBVar4->super_RawBufferView).buffer.ptr;
  }
  pBVar17 = (this->flags).super_RawBufferView.buffer.ptr;
  if (pBVar17 == (Buffer *)0x0) {
    (this->flags).super_RawBufferView.userData = 0;
  }
  cVar15 = this->field_0x80;
  if (((this->flags).super_RawBufferView.userData == 0) &&
     ((pBVar17 == (Buffer *)0x0 ||
      ((this->flags).super_RawBufferView.num != (ulong)(this->super_Geometry).numPrimitives)))) {
    pBVar17 = (Buffer *)operator_new(0x30);
    pDVar5 = (this->super_Geometry).device;
    uVar16 = (this->super_Geometry).numPrimitives;
    (pBVar17->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
    (pBVar17->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__Buffer_02201f40;
    pBVar17->device = pDVar5;
    pBVar17->numBytes = (ulong)uVar16;
    (*(pDVar5->super_State).super_RefCount._vptr_RefCount[2])();
    pcVar18 = Buffer::alloc(pBVar17,(void *)0x0,&pBVar17->shared,MALLOC);
    pBVar17->ptr = pcVar18;
    local_48.ptr = pBVar17;
    (*(pBVar17->super_RefCount)._vptr_RefCount[2])(pBVar17);
    RawBufferView::set(&(this->flags).super_RawBufferView,&local_48,0,1,
                       (ulong)(this->super_Geometry).numPrimitives,RTC_FORMAT_UCHAR);
    if (local_48.ptr != (Buffer *)0x0) {
      (*((local_48.ptr)->super_RefCount)._vptr_RefCount[3])();
    }
    cVar15 = '\x01';
  }
  if (((cVar15 != '\0') && ((this->flags).super_RawBufferView.userData == 0)) &&
     (uVar16 = (this->super_Geometry).numPrimitives, uVar24 = (ulong)uVar16, uVar16 != 0)) {
    uVar19 = 0;
    bVar21 = false;
    do {
      if (uVar19 == (int)uVar24 - 1) {
        bVar25 = false;
      }
      else {
        lVar23 = *(long *)&(this->super_Geometry).field_0x58;
        bVar25 = *(int *)(lVar23 + (uVar19 + 1) * *(long *)&this->field_0x68) ==
                 *(int *)(lVar23 + *(long *)&this->field_0x68 * uVar19) + 1;
      }
      (this->flags).super_RawBufferView.ptr_ofs[(this->flags).super_RawBufferView.stride * uVar19] =
           bVar21;
      pbVar1 = (byte *)((this->flags).super_RawBufferView.ptr_ofs +
                       (this->flags).super_RawBufferView.stride * uVar19);
      *pbVar1 = *pbVar1 | bVar25 * '\x02';
      uVar19 = uVar19 + 1;
      uVar24 = (ulong)(this->super_Geometry).numPrimitives;
      bVar21 = bVar25;
    } while (uVar19 < uVar24);
  }
  this->field_0x80 = 0;
  Geometry::commit(&this->super_Geometry);
  return;
}

Assistant:

void LineSegments::commit() 
  {
    /* verify that stride of all time steps are identical */
    for (unsigned int t=0; t<numTimeSteps; t++) {
      if (vertices[t].getStride() != vertices[0].getStride())
        throw_RTCError(RTC_ERROR_INVALID_OPERATION,"stride of vertex buffers have to be identical for each time step");
      vertices[t].buffer->commitIfNeeded();
    }

    for (auto& buffer : normals) {
      if (buffer.getStride() != normals[0].getStride())
        throw_RTCError(RTC_ERROR_INVALID_OPERATION,"stride of normal buffers have to be identical for each time step");
      buffer.buffer->commitIfNeeded();
    }

    vertices0 = vertices[0];
    if (getCurveType() == GTY_SUBTYPE_ORIENTED_CURVE)
      normals0 = normals[0];

    /* if no flags buffer is specified we manage and calculate the flags buffer */
    if (!flags.buffer) flags.userData = 0; // to encode that we manage this buffer
    bool recompute_flags_buffer = segments.isLocalModified();

    /* resize flags buffer if number of primitives changed */
    if (!flags.userData && (!flags.buffer || flags.size() != numPrimitives))
    {
      Ref<Buffer> buffer = new Buffer(device, numPrimitives*sizeof(char), nullptr, nullptr);
      flags.set(buffer, 0, sizeof(char), numPrimitives, RTC_FORMAT_UCHAR);
      recompute_flags_buffer = true;
    }

    /* recalculate the flags buffer if index buffer got modified */
    if (!flags.userData && recompute_flags_buffer)
    {
      bool hasLeft = false;
      for (size_t i=0; i<numPrimitives; i++) {
        bool hasRight = (i==numPrimitives-1) ? false : segment(i+1) == segment(i)+1;
        flags[i]  = hasLeft  * RTC_CURVE_FLAG_NEIGHBOR_LEFT;
        flags[i] |= hasRight * RTC_CURVE_FLAG_NEIGHBOR_RIGHT;
        hasLeft = hasRight;
      }
      flags.buffer->commit();
    }

    if (recompute_flags_buffer) {
      segments.buffer->commit();
    }
    segments.clearLocalModified();

    Geometry::commit();
  }